

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O0

bool spvtools::opt::anon_unknown_7::ReplaceGroupNonuniformOperationOpCode<(spv::Op)356>
               (IRContext *ctx,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  Op OVar1;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *param_2_local;
  Instruction *inst_local;
  IRContext *ctx_local;
  
  OVar1 = opt::Instruction::opcode(inst);
  if (OVar1 - OpGroupIAddNonUniformAMD < 8) {
    IRContext::AddCapability(ctx,CapabilityGroupNonUniformArithmetic);
    opt::Instruction::SetOpcode(inst,OpGroupNonUniformSMax);
    return true;
  }
  __assert_fail("false && \"Should be replacing a group non uniform arithmetic operation.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp"
                ,0xaa,
                "bool spvtools::opt::(anonymous namespace)::ReplaceGroupNonuniformOperationOpCode(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &) [new_opcode = spv::Op::OpGroupNonUniformSMax]"
               );
}

Assistant:

bool ReplaceGroupNonuniformOperationOpCode(
    IRContext* ctx, Instruction* inst,
    const std::vector<const analysis::Constant*>&) {
  switch (new_opcode) {
    case spv::Op::OpGroupNonUniformIAdd:
    case spv::Op::OpGroupNonUniformFAdd:
    case spv::Op::OpGroupNonUniformUMin:
    case spv::Op::OpGroupNonUniformSMin:
    case spv::Op::OpGroupNonUniformFMin:
    case spv::Op::OpGroupNonUniformUMax:
    case spv::Op::OpGroupNonUniformSMax:
    case spv::Op::OpGroupNonUniformFMax:
      break;
    default:
      assert(
          false &&
          "Should be replacing with a group non uniform arithmetic operation.");
  }

  switch (inst->opcode()) {
    case spv::Op::OpGroupIAddNonUniformAMD:
    case spv::Op::OpGroupFAddNonUniformAMD:
    case spv::Op::OpGroupUMinNonUniformAMD:
    case spv::Op::OpGroupSMinNonUniformAMD:
    case spv::Op::OpGroupFMinNonUniformAMD:
    case spv::Op::OpGroupUMaxNonUniformAMD:
    case spv::Op::OpGroupSMaxNonUniformAMD:
    case spv::Op::OpGroupFMaxNonUniformAMD:
      break;
    default:
      assert(false &&
             "Should be replacing a group non uniform arithmetic operation.");
  }

  ctx->AddCapability(spv::Capability::GroupNonUniformArithmetic);
  inst->SetOpcode(new_opcode);
  return true;
}